

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEditPrivate::updateTimeZone(QDateTimeEditPrivate *this)

{
  bool bVar1;
  Int IVar2;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar3;
  bool dateShown;
  undefined4 in_stack_fffffffffffffed8;
  Section in_stack_fffffffffffffedc;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  QDateTime local_100 [8];
  undefined8 local_f8;
  QDateTime local_f0 [12];
  undefined4 local_e4;
  undefined4 local_e0;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_dc;
  QDateTime local_d8 [8];
  QDateTime local_d0 [8];
  QDateTime local_c8 [8];
  QDateTime local_c0 [8];
  QDateTime local_b8 [8];
  QDateTime local_b0 [8];
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)local_b0);
  ::QVariant::QVariant(&local_28,local_b0);
  ::QVariant::operator=
            ((QVariant *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),in_RDI);
  ::QVariant::~QVariant(&local_28);
  QDateTime::~QDateTime(local_b0);
  QDateTime::~QDateTime(local_b8);
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)local_c0);
  ::QVariant::QVariant(&local_48,local_c0);
  ::QVariant::operator=
            ((QVariant *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),in_RDI);
  ::QVariant::~QVariant(&local_48);
  QDateTime::~QDateTime(local_c0);
  QDateTime::~QDateTime(local_c8);
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)local_d0);
  ::QVariant::QVariant(&local_68,local_d0);
  ::QVariant::operator=
            ((QVariant *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),in_RDI);
  ::QVariant::~QVariant(&local_68);
  QDateTime::~QDateTime(local_d0);
  QDateTime::~QDateTime(local_d8);
  local_dc.super_QFlagsStorage<QDateTimeEdit::Section>.i =
       (QFlagsStorage<QDateTimeEdit::Section>)
       QFlags<QDateTimeEdit::Section>::operator&
                 ((QFlags<QDateTimeEdit::Section> *)in_RDI,in_stack_fffffffffffffedc);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_dc);
  uVar3 = IVar2 != 0;
  if (!(bool)uVar3) {
    local_e0 = ::QVariant::toTime();
    local_e4 = ::QVariant::toTime();
    bVar1 = operator>=((QTime *)in_RDI,
                       (QTime *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (bVar1) {
      local_f8 = ::QVariant::toDate();
      QDate::startOfDay((QTimeZone *)local_f0);
      ::QVariant::QVariant(&local_88,local_f0);
      ::QVariant::operator=((QVariant *)CONCAT17(uVar3,in_stack_fffffffffffffee8),in_RDI);
      ::QVariant::~QVariant(&local_88);
      QDateTime::~QDateTime(local_f0);
      ::QVariant::toDate();
      QDate::endOfDay((QTimeZone *)local_100);
      ::QVariant::QVariant(&local_a8,local_100);
      ::QVariant::operator=((QVariant *)CONCAT17(uVar3,in_stack_fffffffffffffee8),in_RDI);
      ::QVariant::~QVariant(&local_a8);
      QDateTime::~QDateTime(local_100);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::updateTimeZone()
{
    minimum = minimum.toDateTime().toTimeZone(timeZone);
    maximum = maximum.toDateTime().toTimeZone(timeZone);
    value = value.toDateTime().toTimeZone(timeZone);

    // time zone changes can lead to 00:00:00 becomes 01:00:00 and 23:59:59 becomes 00:59:59 (invalid range)
    const bool dateShown = (sections & QDateTimeEdit::DateSections_Mask);
    if (!dateShown) {
        if (minimum.toTime() >= maximum.toTime()){
            minimum = value.toDate().startOfDay(timeZone);
            maximum = value.toDate().endOfDay(timeZone);
        }
    }
}